

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O3

int GaussianOrder(ExpList *ijk)

{
  mapped_type *pmVar1;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  runtime_error *this;
  int am;
  int local_14;
  
  local_14 = ijk->_M_elems[1] + ijk->_M_elems[0] + ijk->_M_elems[2];
  pmVar1 = std::
           map<int,_const_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::vector<int,_std::allocator<int>_>_>_>_>
           ::at((map<int,_const_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)&gindex_map,&local_14);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    ((pmVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (pmVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var2._M_current !=
      (pmVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    return (int)((ulong)((long)_Var2._M_current -
                        (long)(pmVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Gaussian not found in gindex_map");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int GaussianOrder(const ExpList & ijk)
{
    int am = ijk[0] + ijk[1] + ijk[2];

    const std::vector<int> & v = gindex_map.at(am);

    auto it = std::find(v.begin(), v.end(), HashExpList(ijk));
    if(it == v.end())
        throw std::runtime_error("Gaussian not found in gindex_map");

    return std::distance(v.begin(), it);

}